

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

int amqpvalue_get_sasl_challenge(AMQP_VALUE value,SASL_CHALLENGE_HANDLE *sasl_challenge_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  SASL_CHALLENGE_HANDLE pSVar4;
  AMQP_VALUE pAVar5;
  uint32_t list_item_count;
  amqp_binary challenge;
  
  pSVar4 = (SASL_CHALLENGE_HANDLE)malloc(8);
  if (pSVar4 == (SASL_CHALLENGE_HANDLE)0x0) {
    *sasl_challenge_handle = (SASL_CHALLENGE_HANDLE)0x0;
    iVar3 = 0x2b4d;
  }
  else {
    pSVar4->composite_value = (AMQP_VALUE)0x0;
    *sasl_challenge_handle = pSVar4;
    pAVar5 = amqpvalue_get_inplace_described_value(value);
    if (pAVar5 == (AMQP_VALUE)0x0) {
      sasl_challenge_destroy(*sasl_challenge_handle);
      iVar3 = 0x2b55;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAVar5,&list_item_count);
      iVar3 = 0x2b5c;
      if (iVar1 == 0) {
        if (list_item_count == 0) {
          iVar3 = 0x2b89;
        }
        else {
          pAVar5 = amqpvalue_get_list_item(pAVar5,0);
          if (pAVar5 == (AMQP_VALUE)0x0) {
            sasl_challenge_destroy(*sasl_challenge_handle);
            iVar3 = 0x2b6b;
          }
          else {
            AVar2 = amqpvalue_get_type(pAVar5);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy(pAVar5);
              sasl_challenge_destroy(*sasl_challenge_handle);
              iVar3 = 0x2b75;
            }
            else {
              iVar3 = amqpvalue_get_binary(pAVar5,&challenge);
              if (iVar3 == 0) {
                amqpvalue_destroy(pAVar5);
                pAVar5 = amqpvalue_clone(value);
                pSVar4->composite_value = pAVar5;
                iVar3 = 0;
              }
              else {
                amqpvalue_destroy(pAVar5);
                sasl_challenge_destroy(*sasl_challenge_handle);
                iVar3 = 0x2b7f;
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int amqpvalue_get_sasl_challenge(AMQP_VALUE value, SASL_CHALLENGE_HANDLE* sasl_challenge_handle)
{
    int result;
    SASL_CHALLENGE_INSTANCE* sasl_challenge_instance = (SASL_CHALLENGE_INSTANCE*)sasl_challenge_create_internal();
    *sasl_challenge_handle = sasl_challenge_instance;
    if (*sasl_challenge_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            sasl_challenge_destroy(*sasl_challenge_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* challenge */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                sasl_challenge_destroy(*sasl_challenge_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                sasl_challenge_destroy(*sasl_challenge_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                amqp_binary challenge;
                                if (amqpvalue_get_binary(item_value, &challenge) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    sasl_challenge_destroy(*sasl_challenge_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }

                    sasl_challenge_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}